

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_std.cc
# Opt level: O2

bool __thiscall benchmark::Regex::Match(Regex *this,string *str)

{
  bool bVar1;
  
  if (this->init_ == true) {
    bVar1 = std::
            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (str,&this->re_,0);
    return bVar1;
  }
  return false;
}

Assistant:

bool Regex::Match(const std::string& str) {
  if (!init_) {
    return false;
  }

  return std::regex_search(str, re_);
}